

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O2

void __thiscall MonahanPlanner::Load(MonahanPlanner *this,string *filename)

{
  size_t nr;
  PlanningUnitDecPOMDPDiscrete *pPVar1;
  size_t nrA;
  size_t nrS;
  QFunctionsDiscreteNonStationary local_40;
  
  if (this->_m_initialized == false) {
    (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[3])(this);
  }
  pPVar1 = (this->super_AlphaVectorPlanning)._m_pu;
  if (pPVar1 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar1 = (this->super_AlphaVectorPlanning)._m_puShared.px;
  }
  nr = (pPVar1->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  nrA = (**(code **)((long)*(pPVar1->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar1 = (this->super_AlphaVectorPlanning)._m_pu;
  if (pPVar1 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar1 = (this->super_AlphaVectorPlanning)._m_puShared.px;
  }
  nrS = PlanningUnitMADPDiscrete::GetNrStates(&pPVar1->super_PlanningUnitMADPDiscrete);
  AlphaVectorPlanning::ImportValueFunction(&local_40,filename,nr,nrA,nrS);
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::_M_move_assign(&this->_m_qFunction,&local_40);
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::~vector(&local_40);
  this->_m_alreadyComputed = true;
  return;
}

Assistant:

void MonahanPlanner::Load(const std::string &filename)
{
    if(!MonahanPlanner::_m_initialized)
        Initialize();
    _m_qFunction= AlphaVectorPlanning::ImportValueFunction(filename,
                                                           GetPU()->GetHorizon(),
                                                           GetPU()->GetNrJointActions(),
                                                           GetPU()->GetNrStates());
    _m_alreadyComputed=true;
}